

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O0

void __thiscall amrex::EB2::Level::fillLevelSet(Level *this,MultiFab *levelset,Geometry *geom)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  BoxArray *this_00;
  MFIter *mfi_00;
  Box *in_RSI;
  long in_RDI;
  Periodicity PVar4;
  int i_2;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box bx_1;
  Box *fbx;
  pair<int,_amrex::Box> *is;
  iterator __end5;
  iterator __begin5;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *__range5;
  IntVect *iv;
  const_iterator __end4;
  const_iterator __begin4;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *__range4;
  Box bx;
  Box *ccbx;
  Array4<double> *lsfab;
  MFIter mfi;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Real cov_val;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *pshifts;
  int i_1;
  int i;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffbdc;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffbe0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffbec;
  MFIter *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffc00;
  uchar flags_;
  FabArrayBase *in_stack_fffffffffffffc08;
  Geometry *in_stack_fffffffffffffc10;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *isects_00;
  Box *bx_00;
  int in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc34;
  int iVar7;
  int in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  long lVar8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  int in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  CpOp in_stack_fffffffffffffc70;
  undefined1 local_380 [8];
  int local_378;
  long local_370;
  uint local_368;
  int local_364;
  long lStack_360;
  int aiStack_358 [3];
  undefined1 local_34c [4];
  int *local_348;
  reference local_340;
  pair<int,_amrex::Box> *local_338;
  __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
  local_330;
  undefined1 *local_328;
  reference local_300;
  IntVect *local_2f8;
  __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_2f0;
  undefined1 *local_2e8;
  undefined1 local_2e0 [24];
  uint local_2c8;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_2c4;
  undefined1 local_2ac [4];
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *local_2a8;
  long local_2a0 [8];
  long *local_260;
  MFIter local_248;
  undefined1 local_1e8 [24];
  undefined8 local_1d0;
  IntVect local_1c8;
  undefined8 local_1b4;
  int local_1ac;
  undefined1 local_1a8 [24];
  undefined1 *local_190;
  Box *local_180;
  undefined1 *local_170;
  int *local_158;
  int local_14c;
  long lStack_148;
  undefined8 local_140;
  int local_138;
  int *local_130;
  int local_128;
  int local_120;
  int local_11c;
  undefined8 local_118;
  long *local_110;
  undefined1 *local_108;
  undefined4 local_fc;
  int *local_f8;
  undefined4 local_ec;
  int *local_e8;
  undefined4 local_dc;
  int *local_d8;
  undefined4 local_cc;
  int *local_c8;
  undefined4 local_bc;
  int *local_b8;
  undefined4 local_ac;
  int *local_a8;
  int local_9c;
  int *local_98;
  int local_8c;
  undefined1 *local_88;
  undefined4 local_80;
  int local_7c;
  int *local_78;
  int local_6c;
  undefined1 *local_68;
  int local_5c;
  undefined1 *local_58;
  int local_4c;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *local_48;
  int local_3c;
  undefined1 *local_38;
  undefined4 local_30;
  int local_2c;
  undefined1 *local_28;
  int local_1c;
  undefined1 *local_18;
  int local_c;
  undefined1 *local_8;
  
  flags_ = (uchar)((ulong)in_stack_fffffffffffffc00 >> 0x38);
  local_180 = in_RSI;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (in_stack_fffffffffffffbe0,
             (value_type)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  this_00 = (BoxArray *)(in_RDI + 0x2c8);
  mfi_00 = (MFIter *)Periodicity::NonPeriodic();
  uVar6 = 0;
  uVar5 = 0;
  FabArray<amrex::FArrayBox>::ParallelCopy
            ((FabArray<amrex::FArrayBox> *)
             CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),in_stack_fffffffffffffc40
             ,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,in_stack_fffffffffffffc34,
             in_stack_fffffffffffffc30,in_stack_fffffffffffffc60,
             (Periodicity *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
             in_stack_fffffffffffffc70);
  PVar4 = Geometry::periodicity(in_stack_fffffffffffffc10);
  local_1c8.vect._0_8_ = PVar4.period.vect._0_8_;
  local_1b4._0_4_ = local_1c8.vect[0];
  local_1b4._4_4_ = local_1c8.vect[1];
  local_1c8.vect[2] = PVar4.period.vect[2];
  local_1ac = local_1c8.vect[2];
  local_1c8 = PVar4.period.vect;
  Periodicity::shiftIntVect
            ((Periodicity *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  local_190 = local_1a8;
  local_1d0 = 0x3ff0000000000000;
  bVar2 = BoxArray::empty((BoxArray *)0x1499129);
  if (!bVar2) {
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               0x149913e);
    MFIter::MFIter((MFIter *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,flags_);
    bx_00 = local_180;
    while (bVar2 = MFIter::isValid(&local_248), bVar2) {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_fffffffffffffbec,uVar6),mfi_00);
      local_260 = local_2a0;
      MFIter::fabbox(in_stack_fffffffffffffbf0);
      local_108 = local_2e0;
      isects_00 = &local_2c4;
      for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
        local_38 = local_2ac;
        local_3c = local_4c;
        local_1c = local_4c;
        local_c = local_4c;
        if ((local_2c8 & 1 << ((byte)local_4c & 0x1f)) != 0) {
          local_28 = (undefined1 *)
                     ((long)&local_2c4.
                             super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4);
          local_2c = local_4c;
          local_30 = 0xffffffff;
          *(int *)(local_28 + (long)local_4c * 4) = *(int *)(local_28 + (long)local_4c * 4) + -1;
        }
        local_18 = local_38;
      }
      local_8 = local_2ac;
      local_2a8 = &local_2c4;
      local_2e8 = local_190;
      local_48 = isects_00;
      local_2f0._M_current =
           (IntVect *)
           std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin
                     ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                      CONCAT44(in_stack_fffffffffffffbdc,uVar5));
      local_2f8 = (IntVect *)
                  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end
                            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT44(in_stack_fffffffffffffbdc,uVar5));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                 *)mfi_00,
                                (__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffbdc,uVar5)), bVar2) {
        local_300 = __gnu_cxx::
                    __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                    ::operator*(&local_2f0);
        Box::operator+((Box *)mfi_00,(IntVect *)CONCAT44(in_stack_fffffffffffffbdc,uVar5));
        BoxArray::intersections(this_00,bx_00,isects_00);
        local_328 = local_1e8;
        local_330._M_current =
             (pair<int,_amrex::Box> *)
             std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
             begin((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    *)CONCAT44(in_stack_fffffffffffffbdc,uVar5));
        local_338 = (pair<int,_amrex::Box> *)
                    std::
                    vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ::end((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                           *)CONCAT44(in_stack_fffffffffffffbdc,uVar5));
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                   *)mfi_00,
                                  (__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffbdc,uVar5)), bVar2) {
          local_340 = __gnu_cxx::
                      __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                      ::operator*(&local_330);
          Box::operator-((Box *)mfi_00,(IntVect *)CONCAT44(in_stack_fffffffffffffbdc,uVar5));
          local_170 = local_380;
          aiStack_358[0] = (int)((ulong)_local_378 >> 0x20);
          aiStack_358[2] = (int)((ulong)local_370 >> 0x20);
          local_98 = &local_364;
          for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
            local_88 = local_34c;
            local_8c = local_9c;
            local_6c = local_9c;
            local_5c = local_9c;
            if ((local_368 & 1 << ((byte)local_9c & 0x1f)) == 0) {
              local_78 = aiStack_358;
              local_7c = local_9c;
              local_80 = 1;
              local_78[local_9c] = local_78[local_9c] + 1;
            }
            local_68 = local_88;
          }
          local_58 = local_34c;
          local_348 = &local_364;
          local_ac = 0;
          local_364 = local_380._0_4_;
          local_14c = local_364;
          local_bc = 1;
          lStack_360._0_4_ = local_380._4_4_;
          lStack_148._0_4_ = (long)lStack_360;
          local_cc = 2;
          local_d8 = aiStack_358;
          local_dc = 0;
          local_128 = aiStack_358[0];
          local_e8 = aiStack_358;
          local_ec = 1;
          local_140 = CONCAT84(local_370,aiStack_358[0]);
          local_f8 = aiStack_358;
          local_fc = 2;
          local_138 = aiStack_358[2];
          for (iVar3 = _local_378; lVar8._0_4_ = (long)lStack_360, iVar3 <= aiStack_358[2];
              iVar3 = iVar3 + 1) {
            for (; iVar1 = local_364, (int)(long)lVar8 <= local_370;
                lVar8._0_4_ = (long)((int)(long)lVar8 + 1)) {
              while (iVar7 = iVar1, iVar7 <= aiStack_358[0]) {
                local_110 = local_260;
                *(undefined8 *)
                 (*local_260 +
                 ((long)(iVar7 - (int)local_260[4]) +
                  (long)((int)(long)lVar8 - *(int *)((long)local_260 + 0x24)) * local_260[1] +
                 (long)(iVar3 - (int)local_260[5]) * local_260[2]) * 8) = local_1d0;
                local_11c = iVar3;
                local_118._0_4_ = (long)lVar8;
                local_118._4_4_ = iVar7;
                iVar1 = iVar7 + 1;
              }
            }
          }
          local_158 = local_348;
          local_130 = local_348;
          local_120 = local_138;
          local_c8 = local_348;
          local_b8 = local_348;
          local_a8 = local_348;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
          ::operator++(&local_330);
        }
        __gnu_cxx::
        __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
        ::operator++(&local_2f0);
      }
      MFIter::operator++(&local_248);
    }
    MFIter::~MFIter(mfi_00);
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               in_stack_fffffffffffffbf0);
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~vector
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffffbf0);
  return;
}

Assistant:

void
Level::fillLevelSet (MultiFab& levelset, const Geometry& geom) const
{
    levelset.setVal(-1.0);
    levelset.ParallelCopy(m_levelset,0,0,1,0,0);

    const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();

    Real cov_val = 1.0; // for covered cells

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    if (!m_covered_grids.empty())
    {
        std::vector<std::pair<int,Box> > isects;
        for (MFIter mfi(levelset); mfi.isValid(); ++mfi)
        {
            const auto& lsfab = levelset.array(mfi);
            const Box& ccbx = amrex::enclosedCells(mfi.fabbox());
            for (const auto& iv : pshifts)
            {
                m_covered_grids.intersections(ccbx+iv, isects);
                for (const auto& is : isects) {
                    const Box& fbx = amrex::surroundingNodes(is.second-iv);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(fbx, i, j, k,
                    {
                        lsfab(i,j,k) = cov_val;
                    });
                }
            }
        }
    }
}